

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O2

String * Directory::getHomeDirectory(void)

{
  __uid_t __uid;
  passwd *ppVar1;
  String *in_RDI;
  
  __uid = geteuid();
  ppVar1 = getpwuid(__uid);
  if (ppVar1 == (passwd *)0x0) {
    in_RDI->data = &String::emptyData.super_Data;
  }
  else {
    String::fromCString(in_RDI,ppVar1->pw_dir);
  }
  return in_RDI;
}

Assistant:

String Directory::getHomeDirectory()
{
#ifdef _WIN32
    char path[MAX_PATH + 2];
    if (!SHGetSpecialFolderPath(NULL, path, CSIDL_PROFILE, FALSE))
        return String();
    return String::fromCString(path);
#else
    const struct passwd* pw = getpwuid(geteuid());
    if (!pw)
        return String();
    return String::fromCString(pw->pw_dir);
#endif
}